

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

boolean monclass_nogen(char monclass)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0xe;
  while( true ) {
    if (lVar2 == 0x560e) {
      return '\0';
    }
    if (*(char *)((long)crawl + lVar2 + 0x1a) == monclass) break;
    lVar2 = lVar2 + 0x40;
  }
  while ((lVar2 + 0x40 != 0x564e && (*(char *)((long)crawl + lVar2 + 0x1a) == monclass))) {
    lVar1 = lVar2 + -0xf;
    lVar2 = lVar2 + 0x40;
    if ((*(byte *)((long)mons[0].mattk + lVar1) & 2) == 0) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

boolean monclass_nogen(char monclass)
{
	int first, i;

/*	Assumption #1:	monsters of a given class are contiguous in the
 *			mons[] array.
 */
	for (first = LOW_PM; first < SPECIAL_PM; first++)
	    if (mons[first].mlet == monclass) break;
	if (first == SPECIAL_PM) return FALSE;

	for (i = first; i < SPECIAL_PM && mons[i].mlet == monclass; i++)
	    if (!(mons[i].geno & G_NOGEN)) return FALSE;
	return TRUE;
}